

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O0

void __thiscall FormatterTest_FormatInt_Test::TestBody(FormatterTest_FormatInt_Test *this)

{
  bool bVar1;
  format_error *e;
  bool gtest_caught_expected;
  string gtest_expected_message;
  AssertionResult gtest_ar;
  char *in_stack_00000120;
  char *in_stack_00000128;
  int *in_stack_00000130;
  AssertHelper *in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff3c;
  char *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  Type in_stack_ffffffffffffff4c;
  AssertionResult *in_stack_ffffffffffffff50;
  AssertionResult *this_00;
  string local_70 [8];
  Message *in_stack_ffffffffffffff98;
  AssertHelper *in_stack_ffffffffffffffa0;
  undefined1 local_49 [49];
  AssertionResult local_18;
  
  this_00 = &local_18;
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
  if (bVar1) {
    in_stack_ffffffffffffff50 = (AssertionResult *)local_49;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_49 + 1),"missing \'}\' in format string",
               (allocator *)in_stack_ffffffffffffff50);
    std::allocator<char>::~allocator((allocator<char> *)local_49);
    bVar1 = testing::internal::AlwaysTrue();
    in_stack_ffffffffffffff4c = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff4c);
    if (bVar1) {
      fmt::v5::format<char[5],int>(&this_00->success_,(int *)in_stack_ffffffffffffff50);
      std::__cxx11::string::~string(local_70);
    }
    testing::AssertionResult::operator<<
              (in_stack_ffffffffffffff50,
               (char (*) [100])CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    std::__cxx11::string::~string((string *)(local_49 + 1));
  }
  testing::Message::Message((Message *)in_stack_ffffffffffffff50);
  testing::AssertionResult::failure_message((AssertionResult *)0x1667ed);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
             in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,in_stack_ffffffffffffff30);
  testing::internal::AssertHelper::operator=(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffff20);
  testing::Message::~Message((Message *)0x166839);
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x166888);
  check_unknown_types<int>(in_stack_00000130,in_stack_00000128,in_stack_00000120);
  return;
}

Assistant:

TEST(FormatterTest, FormatInt) {
  EXPECT_THROW_MSG(format("{0:v", 42),
      format_error, "missing '}' in format string");
  check_unknown_types(42, "bBdoxXn", "integer");
}